

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O1

uint __thiscall
FMB::FiniteModelMultiSorted::evaluateGroundTerm(FiniteModelMultiSorted *this,Term *term)

{
  uint uVar1;
  Entry *pEVar2;
  pair<unsigned_int,_unsigned_int> pVar3;
  undefined8 *puVar4;
  OperatorType *pOVar5;
  TermList TVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint *res;
  DArray<unsigned_int> args;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._M_dataplus._M_p = (pointer)term;
  pEVar2 = ::Lib::
           DHMap<Kernel::Term_*,_std::pair<unsigned_int,_unsigned_int>,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findEntry(&this->_domainConstantsRev,(Term **)&local_70);
  if (pEVar2 == (Entry *)0x0) {
    uVar7 = (ulong)*(uint *)(*(long *)(*(long *)(DAT_00b7e1b0 + 0x60) +
                                      (long)(int)term->_functor * 8) + 0x20);
    if (uVar7 == 0) {
      puVar4 = (undefined8 *)0x0;
    }
    else {
      uVar8 = uVar7 * 4 + 0xf & 0x7fffffff0;
      if (uVar8 == 0) {
        puVar4 = (undefined8 *)
                 ::Lib::FixedSizeAllocator<8UL>::alloc
                           ((FixedSizeAllocator<8UL> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
      }
      else if (uVar8 < 0x11) {
        puVar4 = (undefined8 *)
                 ::Lib::FixedSizeAllocator<16UL>::alloc
                           ((FixedSizeAllocator<16UL> *)
                            (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      }
      else if (uVar8 < 0x19) {
        puVar4 = (undefined8 *)
                 ::Lib::FixedSizeAllocator<24UL>::alloc
                           ((FixedSizeAllocator<24UL> *)
                            (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
      }
      else if (uVar8 < 0x21) {
        puVar4 = (undefined8 *)
                 ::Lib::FixedSizeAllocator<32UL>::alloc
                           ((FixedSizeAllocator<32UL> *)
                            (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
      }
      else if (uVar8 < 0x31) {
        puVar4 = (undefined8 *)
                 ::Lib::FixedSizeAllocator<48UL>::alloc
                           ((FixedSizeAllocator<48UL> *)
                            (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
      }
      else if (uVar8 < 0x41) {
        puVar4 = (undefined8 *)
                 ::Lib::FixedSizeAllocator<64UL>::alloc
                           ((FixedSizeAllocator<64UL> *)
                            (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
      }
      else {
        puVar4 = (undefined8 *)::operator_new(uVar8,0x10);
      }
      if (uVar7 != 0) {
        memset(puVar4,0,uVar7 << 2);
      }
    }
    if (uVar7 != 0) {
      iVar11 = 0;
      uVar8 = 0;
      do {
        uVar1 = evaluateGroundTerm(this,(Term *)term->_args
                                                [(int)((*(uint *)&term->field_0xc & 0xfffffff) +
                                                      iVar11)]._content);
        *(uint *)((long)puVar4 + uVar8 * 4) = uVar1;
        if (uVar1 == 0) {
          puVar4 = (undefined8 *)__cxa_allocate_exception(0x50);
          Kernel::Term::toString_abi_cxx11_(&local_70,term,true);
          std::operator+(&local_50,"Could not evaluate ",&local_70);
          *puVar4 = &PTR_cry_00b69f40;
          puVar4[1] = puVar4 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar4 + 1),local_50._M_dataplus._M_p,
                     local_50._M_dataplus._M_p + local_50._M_string_length);
          *puVar4 = &PTR_cry_00b6a028;
          *(undefined4 *)(puVar4 + 5) = 0;
          puVar4[6] = puVar4 + 8;
          puVar4[7] = 0;
          *(undefined1 *)(puVar4 + 8) = 0;
          __cxa_throw(puVar4,&::Lib::UserErrorException::typeinfo,
                      ::Lib::UserErrorException::~UserErrorException);
        }
        uVar8 = uVar8 + 1;
        iVar11 = iVar11 + -1;
      } while (uVar7 != uVar8);
    }
    pOVar5 = Kernel::Signature::Symbol::fnType
                       (*(Symbol **)(*(long *)(DAT_00b7e1b0 + 0x60) + (ulong)term->_functor * 8));
    uVar1 = (this->_f_offsets)._array[term->_functor];
    if (uVar7 != 0) {
      iVar11 = 1;
      uVar8 = 0;
      do {
        iVar10 = *(int *)((long)puVar4 + uVar8 * 4);
        uVar9 = (uint)uVar8;
        if (uVar9 < pOVar5->_typeArgsArity) {
          TVar6 = Kernel::AtomicSort::superSort();
        }
        else {
          TVar6._content =
               *(uint64_t *)(pOVar5->_key + (ulong)(uVar9 - pOVar5->_typeArgsArity) * 8 + 8);
        }
        iVar10 = (iVar10 + -1) * iVar11;
        iVar11 = iVar11 * (this->_sizes)._array[*(uint *)(TVar6._content + 8)];
        uVar1 = uVar1 + iVar10;
        uVar8 = (ulong)(uVar9 + 1);
      } while (uVar8 < uVar7);
    }
    uVar1 = (this->_f_interpretation)._array[uVar1];
    if (puVar4 != (undefined8 *)0x0) {
      uVar7 = uVar7 * 4 + 0xf & 0xfffffffffffffff0;
      if (uVar7 == 0) {
        *puVar4 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar4;
      }
      else if (uVar7 < 0x11) {
        *puVar4 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puVar4;
      }
      else if (uVar7 < 0x19) {
        *puVar4 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puVar4;
      }
      else if (uVar7 < 0x21) {
        *puVar4 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puVar4;
      }
      else if (uVar7 < 0x31) {
        *puVar4 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puVar4;
      }
      else if (uVar7 < 0x41) {
        *puVar4 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar4;
      }
      else {
        operator_delete(puVar4,0x10);
      }
    }
  }
  else {
    pVar3 = getDomainConstant(this,term);
    uVar1 = pVar3.first;
  }
  return uVar1;
}

Assistant:

unsigned FiniteModelMultiSorted::evaluateGroundTerm(Term* term)
{
  ASS(term->ground());

#if DEBUG_MODEL
  cout << "evaluating ground term " << term->toString() << endl;
  cout << "domain constant status " << isDomainConstant(term) << endl;
#endif
  if(isDomainConstant(term)) return getDomainConstant(term).first;

  unsigned arity = env.signature->functionArity(term->functor());
  DArray<unsigned> args(arity);
  for(unsigned i=0;i<arity;i++){
    args[i] = evaluateGroundTerm(term->nthArgument(i)->term());
    if(args[i]==0) USER_ERROR("Could not evaluate "+term->toString());
  }

  OperatorType* sig = env.signature->getFunction(term->functor())->fnType();
  unsigned var = _f_offsets[term->functor()];
  unsigned mult = 1;
  for(unsigned i=0;i<args.size();i++){
    var += mult*(args[i]-1);
    unsigned s = sig->arg(i).term()->functor();
    mult *=_sizes[s];
  }
#if VDEBUG
  if((term->functor()+1)<_f_offsets.size()) ASS_L(var,_f_offsets[term->functor()+1]);
#endif
  ASS_L(var,_f_interpretation.size());

  return _f_interpretation[var];
}